

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O3

int __thiscall coda_url::reset(coda_url *this)

{
  if (this->val_str != (char *)0x0) {
    free(this->val_str);
  }
  this->dom_str = (char *)0x0;
  this->val_str = (char *)0x0;
  this->dom_len = 0;
  this->val_len = 0;
  return 0;
}

Assistant:

int coda_url::reset()
{
	if (allocated())
	{
		free(val_str);
	}

	val_str = dom_str = NULL;
	val_len = dom_len = 0;

	return 0;
}